

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PClass * __thiscall ClassReg::RegisterClass(ClassReg *this)

{
  PClass *cls;
  PClass *pPVar1;
  
  cls = this->MyClass;
  if (cls == (PClass *)0x0) {
    if (2 < *(uint *)&this->field_0x28 >> 0x1e) {
      __assert_fail("0 && \"Class registry has an invalid meta class identifier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0xbca,"PClass *ClassReg::RegisterClass()");
    }
    if (RegisterClass::metaclasses[*(uint *)&this->field_0x28 >> 0x1c]->MyClass == (PClass *)0x0) {
      RegisterClass(RegisterClass::metaclasses[*(uint *)&this->field_0x28 >> 0x1c]);
    }
    cls = (PClass *)
          PClass::CreateNew(RegisterClass::metaclasses[*(uint *)&this->field_0x28 >> 0x1c]->MyClass)
    ;
    SetupClass(this,cls);
    PClass::InsertIntoHash(cls);
    if (this->ParentType != (ClassReg *)0x0) {
      pPVar1 = RegisterClass(this->ParentType);
      cls->ParentClass = pPVar1;
    }
  }
  return cls;
}

Assistant:

PClass *ClassReg::RegisterClass()
{
	static ClassReg *const metaclasses[] =
	{
		&PClass::RegistrationInfo,
		&PClassActor::RegistrationInfo,
		&PClassInventory::RegistrationInfo,
		&PClassAmmo::RegistrationInfo,
		&PClassHealth::RegistrationInfo,
		&PClassPuzzleItem::RegistrationInfo,
		&PClassWeapon::RegistrationInfo,
		&PClassPlayerPawn::RegistrationInfo,
		&PClassType::RegistrationInfo,
		&PClassClass::RegistrationInfo,
		&PClassWeaponPiece::RegistrationInfo,
		&PClassPowerupGiver::RegistrationInfo,
	};

	// Skip classes that have already been registered
	if (MyClass != NULL)
	{
		return MyClass;
	}

	// Add type to list
	PClass *cls;

	if (MetaClassNum >= countof(metaclasses))
	{
		assert(0 && "Class registry has an invalid meta class identifier");
	}

	if (metaclasses[MetaClassNum]->MyClass == NULL)
	{ // Make sure the meta class is already registered before registering this one
		metaclasses[MetaClassNum]->RegisterClass();
	}
	cls = static_cast<PClass *>(metaclasses[MetaClassNum]->MyClass->CreateNew());

	SetupClass(cls);
	cls->InsertIntoHash();
	if (ParentType != NULL)
	{
		cls->ParentClass = ParentType->RegisterClass();
	}
	return cls;
}